

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-stm.c
# Opt level: O1

int lcopy(lua_State *L)

{
  int *piVar1;
  int iVar2;
  int *piVar3;
  undefined8 *puVar4;
  
  puVar4 = (undefined8 *)lua_touserdata(L,1);
  piVar3 = (int *)*puVar4;
  while( true ) {
    do {
    } while (*piVar3 != 0);
    LOCK();
    piVar3[1] = piVar3[1] + 1;
    UNLOCK();
    if (*piVar3 == 0) break;
    LOCK();
    piVar3[1] = piVar3[1] + -1;
    UNLOCK();
  }
  LOCK();
  piVar1 = piVar3 + 2;
  iVar2 = *piVar1;
  *piVar1 = *piVar1 + 1;
  UNLOCK();
  LOCK();
  piVar3[1] = piVar3[1] + -1;
  UNLOCK();
  if (iVar2 < 1) {
    __assert_fail("ref > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/lualib-src/lua-stm.c"
                  ,0x58,"void stm_grab(struct stm_object *)");
  }
  lua_pushlightuserdata(L,(void *)*puVar4);
  return 1;
}

Assistant:

static int
lcopy(lua_State *L) {
	struct boxstm * box = lua_touserdata(L, 1);
	stm_grab(box->obj);
	lua_pushlightuserdata(L, box->obj);
	return 1;
}